

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<double>_>::MultAdd
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *x,
          TPZFMatrix<std::complex<double>_> *y,TPZFMatrix<std::complex<double>_> *z,
          complex<double> alpha,complex<double> beta,int opt)

{
  complex<double> **ppcVar1;
  complex<double> *pcVar2;
  undefined1 auVar3 [16];
  double dVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int64_t iVar9;
  complex<double> *pcVar10;
  int iVar11;
  ulong uVar12;
  int opt_00;
  complex<double> *pcVar13;
  undefined1 (*pauVar14) [16];
  long lVar15;
  complex<double> *pcVar16;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  double dVar17;
  complex<double> beta_00;
  long local_e0;
  double local_d8;
  double dStack_d0;
  long local_c0;
  undefined1 local_b8 [16];
  long local_a8;
  TPZSkylMatrix<std::complex<double>_> *local_a0;
  TPZFMatrix<std::complex<double>_> *local_98;
  double local_90;
  double dStack_88;
  long local_80;
  TPZFMatrix<std::complex<double>_> *local_78;
  long local_70;
  long local_68;
  long local_60;
  complex<double> local_58;
  double local_48;
  double dStack_40;
  
  opt_00 = alpha._M_value._8_4_;
  uVar12 = alpha._M_value._0_8_;
  iVar11 = alpha._M_value._0_4_;
  uVar8 = uVar12 & 0xffffffff;
  local_90 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  dStack_88 = in_XMM1_Qa;
  if (iVar11 == 0) {
    iVar9 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    if (iVar9 == (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)
    goto LAB_00cbe89b;
LAB_00cbe8a1:
    TPZMatrix<std::complex<double>_>::Error
              ("virtual void TPZSkylMatrix<std::complex<double>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<double>]"
               ," <matrixs with incompatible dimensions>");
    iVar9 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  }
  else {
    iVar9 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
LAB_00cbe89b:
    if ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow != iVar9)
    goto LAB_00cbe8a1;
  }
  if ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow == iVar9) {
    lVar6 = (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    lVar15 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    lVar7 = lVar6;
    if (lVar6 == lVar15) goto LAB_00cbe8e9;
  }
  else {
    lVar15 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  }
  (*(z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xe])(z,iVar9,lVar15);
  lVar6 = (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  lVar7 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
LAB_00cbe8e9:
  if ((((lVar7 != (y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) ||
       (lVar7 != lVar6)) ||
      (lVar15 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow,
      lVar15 != (y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) ||
     (lVar15 != (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x.Cols = ",9);
    poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," y.Cols()",9);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," z.Cols() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," x.Rows() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," y.Rows() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," z.Rows() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    TPZMatrix<std::complex<double>_>::Error
              ("virtual void TPZSkylMatrix<std::complex<double>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<double>]"
               ," incompatible dimensions\n");
  }
  beta_00._M_value._8_8_ = uVar12;
  beta_00._M_value._0_8_ = uVar8;
  local_78 = z;
  TPZMatrix<std::complex<double>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<double>_>,y,z,beta_00,opt_00);
  local_80 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  if (0 < local_80) {
    local_a8 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
    local_e0 = 0;
    local_a0 = this;
    local_98 = x;
    do {
      if (0 < local_a8) {
        lVar15 = 0;
        do {
          ppcVar1 = (this->fElem).fStore;
          local_60 = (long)ppcVar1[lVar15 + 1] - (long)ppcVar1[lVar15];
          local_c0 = local_60 >> 4;
          local_68 = (lVar15 - local_c0) + 1;
          local_b8 = ZEXT816(0);
          local_70 = local_68 * 0x10;
          pcVar16 = x->fElem +
                    (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow * local_e0
                    + local_68;
          pcVar2 = ppcVar1[lVar15];
          pcVar10 = (complex<double> *)(local_60 + (long)pcVar2);
          while (pcVar13 = pcVar10 + -1, pcVar2 < pcVar13) {
            if (iVar11 == 0) {
              local_d8 = *(double *)pcVar13->_M_value;
              dStack_d0 = -*(double *)(pcVar10[-1]._M_value + 8);
            }
            else {
              local_d8 = *(double *)pcVar13->_M_value;
              dStack_d0 = *(double *)(pcVar10[-1]._M_value + 8);
            }
            std::complex<double>::operator*=((complex<double> *)&local_d8,pcVar16);
            dStack_d0 = dStack_d0 + (double)local_b8._8_8_;
            local_b8._8_4_ = SUB84(dStack_d0,0);
            local_b8._0_8_ = local_d8 + (double)local_b8._0_8_;
            local_b8._12_4_ = (int)((ulong)dStack_d0 >> 0x20);
            pcVar16 = pcVar16 + 1;
            pcVar10 = pcVar13;
          }
          if (pcVar13 == pcVar2) {
            local_d8 = *(double *)pcVar2->_M_value;
            dStack_d0 = *(double *)(pcVar2->_M_value + 8);
            std::complex<double>::operator*=((complex<double> *)&local_d8,pcVar16);
            dStack_d0 = dStack_d0 + (double)local_b8._8_8_;
            local_b8._8_4_ = SUB84(dStack_d0,0);
            local_b8._0_8_ = local_d8 + (double)local_b8._0_8_;
            local_b8._12_4_ = (int)((ulong)dStack_d0 >> 0x20);
          }
          local_d8 = (double)local_b8._0_8_;
          dStack_d0 = (double)local_b8._8_8_;
          std::complex<double>::operator*=
                    ((complex<double> *)&local_d8,(complex<double> *)&local_90);
          lVar6 = (local_78->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
          if ((lVar6 <= lVar15) ||
             ((local_78->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
              local_e0)) {
            local_48 = local_d8;
            dStack_40 = dStack_d0;
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = lVar6 * local_e0;
          pcVar10 = local_78->fElem + lVar6 + lVar15;
          dVar4 = *(double *)(pcVar10->_M_value + 8);
          dVar17 = local_d8 + *(double *)pcVar10->_M_value;
          pcVar10 = local_78->fElem + lVar6 + lVar15;
          *(double *)pcVar10->_M_value = dVar17;
          *(double *)(pcVar10->_M_value + 8) = dStack_d0 + dVar4;
          if (((lVar15 - local_c0 < -1) ||
              (lVar6 = (local_78->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow,
              lVar6 <= local_68)) ||
             ((local_78->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
              local_e0)) {
            local_c0 = lVar15;
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar10 = local_78->fElem;
          local_c0 = lVar15;
          (*(local_98->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(local_98,lVar15,local_e0);
          local_b8._4_4_ = extraout_XMM0_Db;
          local_b8._0_4_ = extraout_XMM0_Da;
          local_b8._8_8_ = dVar17;
          pcVar16 = (complex<double> *)((local_a0->fElem).fStore[lVar15][-1]._M_value + local_60);
          if (pcVar2 < pcVar16) {
            pauVar14 = (undefined1 (*) [16])(pcVar10[lVar6 * local_e0]._M_value + local_70);
            do {
              pcVar10 = pcVar16;
              if (iVar11 != 0) {
                local_58._M_value._0_8_ = *(undefined8 *)pcVar16->_M_value;
                local_58._M_value._8_8_ = *(ulong *)(pcVar16->_M_value + 8) ^ 0x8000000000000000;
                pcVar10 = &local_58;
              }
              dStack_d0 = dStack_88;
              local_d8 = local_90;
              std::complex<double>::operator*=((complex<double> *)&local_d8,pcVar10);
              std::complex<double>::operator*=
                        ((complex<double> *)&local_d8,(complex<double> *)local_b8);
              dStack_d0 = *(double *)(*pauVar14 + 8) + dStack_d0;
              auVar3._8_4_ = SUB84(dStack_d0,0);
              auVar3._0_8_ = *(double *)*pauVar14 + local_d8;
              auVar3._12_4_ = (int)((ulong)dStack_d0 >> 0x20);
              *pauVar14 = auVar3;
              pauVar14 = pauVar14 + 1;
              pcVar16 = pcVar16 + -1;
            } while (pcVar2 < pcVar16);
          }
          lVar15 = local_c0 + 1;
          x = local_98;
          this = local_a0;
        } while (lVar15 != local_a8);
      }
      local_e0 = local_e0 + 1;
    } while (local_e0 != local_80);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	
	if (this->fDecomposed != ENoDecompose) {
        //		DebugStop();
	}
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," <matrixs with incompatible dimensions>" );
	if(z.Rows() != x.Rows() || z.Cols() != x.Cols()) z.Redim(x.Rows(),x.Cols());
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		cout << "x.Cols = " << x.Cols() << " y.Cols()"<< y.Cols() << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows() << " y.Rows() "<< y.Rows() << " z.Rows() "<< z.Rows() << endl;
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);

	const int64_t rows = this->Rows();
	const int64_t xcols = x.Cols();
	for (auto ic = 0; ic < xcols; ic++) {
		for(auto r = 0 ; r < rows ; r++ ) {
			const int64_t offset = Size(r);
			TVar val = 0.;
			const TVar *p = &x.g((r-offset+1),ic);
			TVar *diag = fElem[r] + offset-1;
			const TVar *diaglast = fElem[r];
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) val += *diag-- * *p;
                    else val += std::conj(*diag--) * *p;
                }else{
                    val += *diag-- * *p;
                }
				p ++;
			}
			if( diag == diaglast ) val += *diag * *p;
			z(r,ic) += val*alpha;
			TVar *zp = &z((r-offset+1),ic);
			val = x.GetVal(r,ic);
			diag = fElem[r] + offset-1;
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) *zp += alpha * std::conj(*diag--) * val;
                    else *zp += alpha * *diag-- * val;
                }else{
                    *zp += alpha * *diag-- * val;
                }
                zp ++;
			}
		}
	}
}